

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track>
GTrackWithSectors<FMEncoder>
          (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           *sectors,size_t post_index_address_mark_bytes,uint8_t post_index_address_mark_value,
          size_t pre_address_mark_bytes,size_t post_address_mark_bytes,
          uint8_t post_address_mark_value,size_t pre_data_mark_bytes,size_t post_data_bytes,
          uint8_t post_data_value,size_t expected_track_bytes)

{
  byte input;
  ulong __new_size;
  undefined8 *puVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  long *plVar5;
  byte fuzzy_mask;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  undefined7 in_register_00000089;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  shared_ptr<Storage::Disk::Track> sVar14;
  undefined7 in_stack_00000019;
  ulong in_stack_00000028;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *__range1;
  uint8_t local_2f0;
  undefined1 local_2b8 [16];
  PCMSegment segment;
  FMEncoder shifter;
  
  uVar9 = CONCAT71(in_register_00000089,post_address_mark_value);
  uVar12 = CONCAT71(in_register_00000011,post_index_address_mark_value);
  segment.length_of_a_bit.length = 1;
  segment.length_of_a_bit.clock_rate = 1;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::reserve(&segment.data,in_stack_00000028 * 8);
  FMEncoder::FMEncoder(&shifter,&segment.data,(vector<bool,_std::allocator<bool>_> *)0x0);
  uVar10 = CONCAT71(in_stack_00000019,post_data_value);
  lVar7 = 0;
  for (plVar5 = *(long **)post_index_address_mark_bytes;
      plVar5 != *(long **)(post_index_address_mark_bytes + 8); plVar5 = plVar5 + 1) {
    lVar7 = lVar7 + (int)(0x80 << (*(byte *)(*plVar5 + 3) & 0x1f) | 2);
  }
  __new_size = (in_stack_00000028 / 10 + in_stack_00000028) * 8;
  for (; (__new_size <=
          (((uVar9 + post_address_mark_bytes + uVar10 + post_data_bytes) * 2 + 0x10) *
           ((ulong)((long)*(long **)(post_index_address_mark_bytes + 8) -
                   (long)*(long **)post_index_address_mark_bytes) >> 3) + (uVar12 + lVar7) * 2) * 8
          + 0x10 &&
         (((uVar9 != 0 || post_address_mark_bytes != 0) || (post_data_bytes != 0 || uVar10 != 0)) ||
          uVar12 != 0)); uVar9 = uVar9 >> 1) {
    uVar12 = uVar12 >> 1;
    post_address_mark_bytes = post_address_mark_bytes >> 1;
    post_data_bytes = post_data_bytes >> 1;
    uVar10 = uVar10 >> 1;
  }
  FMEncoder::add_index_address_mark(&shifter);
  local_2f0 = (uint8_t)pre_address_mark_bytes;
  while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
    FMEncoder::add_byte(&shifter,local_2f0,'\0');
  }
  puVar1 = *(undefined8 **)(post_index_address_mark_bytes + 8);
  for (puVar4 = *(undefined8 **)post_index_address_mark_bytes; puVar4 != puVar1; puVar4 = puVar4 + 1
      ) {
    puVar2 = (uint8_t *)*puVar4;
    uVar12 = post_address_mark_bytes;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
      FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,'\0','\0');
    }
    FMEncoder::add_ID_address_mark((FMEncoder *)&shifter.super_Encoder);
    FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,*puVar2,'\0');
    FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,puVar2[1],'\0');
    FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,puVar2[2],'\0');
    FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,puVar2[3],'\0');
    Storage::Encodings::MFM::Encoder::add_crc(&shifter.super_Encoder,(bool)puVar2[0x21]);
    uVar12 = uVar9;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, uVar6 = post_data_bytes, bVar13) {
      FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,(uint8_t)pre_data_mark_bytes,'\0');
    }
    while (uVar6 != 0) {
      FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,'\0','\0');
      uVar6 = uVar6 - 1;
    }
    uVar12 = uVar10;
    if (*(long *)(puVar2 + 8) != *(long *)(puVar2 + 0x10)) {
      if (puVar2[0x22] == '\x01') {
        FMEncoder::add_deleted_data_address_mark((FMEncoder *)&shifter.super_Encoder);
      }
      else {
        FMEncoder::add_data_address_mark((FMEncoder *)&shifter.super_Encoder);
      }
      uVar11 = (ulong)(0x80 << (puVar2[3] & 0x1f));
      plVar5 = *(long **)(puVar2 + 8);
      uVar6 = 0;
      if ((ulong)((*(long *)(puVar2 + 0x10) - (long)plVar5) / 0x18) < 2) {
        for (; (uVar6 < (ulong)(plVar5[1] - *plVar5) && (uVar6 < uVar11)); uVar6 = uVar6 + 1) {
          FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,*(uint8_t *)(*plVar5 + uVar6),'\0'
                             );
          plVar5 = *(long **)(puVar2 + 8);
        }
      }
      else {
        for (; (uVar6 < (ulong)(plVar5[1] - *plVar5) && (uVar6 < uVar11)); uVar6 = uVar6 + 1) {
          input = *(byte *)(*plVar5 + uVar6);
          fuzzy_mask = 0;
          bVar8 = input;
          while (plVar5 = plVar5 + 3, plVar5 != *(long **)(puVar2 + 0x10)) {
            fuzzy_mask = fuzzy_mask | *(byte *)(*plVar5 + uVar6) ^ bVar8;
            bVar8 = bVar8 & ~fuzzy_mask;
          }
          FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,input,fuzzy_mask);
          plVar5 = *(long **)(puVar2 + 8);
        }
      }
      for (; uVar6 < uVar11; uVar6 = uVar6 + 1) {
        FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,'\0','\0');
      }
      Storage::Encodings::MFM::Encoder::add_crc(&shifter.super_Encoder,(bool)puVar2[0x20]);
    }
    while (uVar12 != 0) {
      FMEncoder::add_byte((FMEncoder *)&shifter.super_Encoder,(uint8_t)expected_track_bytes,'\0');
      uVar12 = uVar12 - 1;
    }
  }
  while (uVar10 = (ulong)segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
        uVar10 < in_stack_00000028 * 8) {
    FMEncoder::add_byte(&shifter,'\0','\0');
  }
  if (__new_size < uVar10) {
    std::vector<bool,_std::allocator<bool>_>::resize(&segment.data,__new_size,false);
  }
  std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment>((PCMSegment *)local_2b8);
  uVar3 = local_2b8._8_8_;
  local_2b8._8_8_ = (_Bit_type *)0x0;
  (sectors->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
  (sectors->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar3;
  local_2b8._0_4_ = 0;
  local_2b8._4_4_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 8));
  Storage::Disk::PCMSegment::~PCMSegment(&segment);
  sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sectors;
  return (shared_ptr<Storage::Disk::Track>)
         sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track>
		GTrackWithSectors(
			const std::vector<const Sector *> &sectors,
			std::size_t post_index_address_mark_bytes, uint8_t post_index_address_mark_value,
			std::size_t pre_address_mark_bytes,
			std::size_t post_address_mark_bytes, uint8_t post_address_mark_value,
			std::size_t pre_data_mark_bytes,
			std::size_t post_data_bytes, uint8_t post_data_value,
			std::size_t expected_track_bytes) {
	Storage::Disk::PCMSegment segment;
	segment.data.reserve(expected_track_bytes * 8);
	T shifter(segment.data);

	// Make a pre-estimate of output size, in case any of the idealised gaps
	// provided need to be shortened.
	const size_t data_size = shifter.item_size(SurfaceItem::Data);
	const size_t mark_size = shifter.item_size(SurfaceItem::Mark);
	const size_t max_size = (expected_track_bytes + (expected_track_bytes / 10)) * 8;

	size_t total_sector_bytes = 0;
	for(const auto sector : sectors) {
		total_sector_bytes += size_t(128 << sector->size) + 2;
	}

	// Seek appropriate gap sizes, if the defaults don't allow all data to fit.
	while(true) {
		const size_t size =
			mark_size +
			post_index_address_mark_bytes * data_size +
			total_sector_bytes * data_size +
			sectors.size() * (
				(pre_address_mark_bytes + 6 + post_address_mark_bytes + pre_data_mark_bytes + post_data_bytes) * data_size + 2 * mark_size
			);

		// If this track already fits, do nothing.
		if(size*8 < max_size) break;

		// If all gaps are already zero, do nothing.
		if(!post_index_address_mark_bytes && !pre_address_mark_bytes && !post_address_mark_bytes && !pre_data_mark_bytes && !post_data_bytes)
			break;

		// Very simple solution: try halving all gaps.
		post_index_address_mark_bytes >>= 1;
		pre_address_mark_bytes >>= 1;
		post_address_mark_bytes >>= 1;
		pre_data_mark_bytes >>= 1;
		post_data_bytes >>= 1;
	}

	// Output the index mark.
	shifter.add_index_address_mark();

	// Add the post-index mark.
	for(std::size_t c = 0; c < post_index_address_mark_bytes; c++) shifter.add_byte(post_index_address_mark_value);

	// Add sectors.
	for(const Sector *sector : sectors) {
		// Gap.
		for(std::size_t c = 0; c < pre_address_mark_bytes; c++) shifter.add_byte(0x00);

		// Sector header.
		shifter.add_ID_address_mark();
		shifter.add_byte(sector->address.track);
		shifter.add_byte(sector->address.side);
		shifter.add_byte(sector->address.sector);
		shifter.add_byte(sector->size);
		shifter.add_crc(sector->has_header_crc_error);

		// Gap.
		for(std::size_t c = 0; c < post_address_mark_bytes; c++) shifter.add_byte(post_address_mark_value);
		for(std::size_t c = 0; c < pre_data_mark_bytes; c++) shifter.add_byte(0x00);

		// Data, if attached.
		if(!sector->samples.empty()) {
			if(sector->is_deleted)
				shifter.add_deleted_data_address_mark();
			else
				shifter.add_data_address_mark();

			std::size_t c = 0;
			std::size_t declared_length = size_t(128 << sector->size);
			if(sector->samples.size() > 1) {
				// For each byte, mark as fuzzy any bits that differ. Which isn't exactly the
				// same thing as obeying the multiple samples, as it discards the implied
				// probabilities of different values.
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					auto sample_iterator = sector->samples.begin();
					uint8_t value = (*sample_iterator)[c], fuzzy_mask = 0;

					++sample_iterator;
					while(sample_iterator != sector->samples.end()) {
						// Mark as fuzzy any bits that differ here from the
						// canonical value, and zero them out in the original.
						// That might cause them to retrigger, but who cares?
						fuzzy_mask |= value ^ (*sample_iterator)[c];
						value &= ~fuzzy_mask;

						++sample_iterator;
					}
					shifter.add_byte(sector->samples[0][c], fuzzy_mask);
				}
			} else {
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					shifter.add_byte(sector->samples[0][c]);
				}
			}
			for(; c < declared_length; c++) {
				shifter.add_byte(0x00);
			}
			shifter.add_crc(sector->has_data_crc_error);
		}

		// Gap.
		for(std::size_t c = 0; c < post_data_bytes; c++) shifter.add_byte(post_data_value);
	}

	while(segment.data.size() < expected_track_bytes*8) shifter.add_byte(0x00);

	// Allow the amount of data written to be up to 10% more than the expected size. Which is generous.
	if(segment.data.size() > max_size) segment.data.resize(max_size);

	return std::make_shared<Storage::Disk::PCMTrack>(std::move(segment));
}